

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall google::protobuf::Descriptor::map_value(Descriptor *this)

{
  bool bVar1;
  int iVar2;
  int v2;
  MessageOptions *this_00;
  char *failure_msg;
  LogMessage *pLVar3;
  LogMessage local_38;
  Voidify local_21;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  Descriptor *this_local;
  
  absl_log_internal_check_op_result = (Nullable<const_char_*>)this;
  this_00 = options(this);
  bVar1 = MessageOptions::map_entry(this_00);
  if (bVar1) {
    iVar2 = field_count(this);
    iVar2 = absl::lts_20250127::log_internal::GetReferenceableValue(iVar2);
    v2 = absl::lts_20250127::log_internal::GetReferenceableValue(2);
    local_20 = absl::lts_20250127::log_internal::Check_EQImpl(iVar2,v2,"field_count() == 2");
    if (local_20 != (Nullable<const_char_*>)0x0) {
      failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
                 ,0xb1d,failure_msg);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_21,pLVar3);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_38);
    }
    this_local = (Descriptor *)field(this,1);
  }
  else {
    this_local = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* Descriptor::map_value() const {
  if (!options().map_entry()) return nullptr;
  ABSL_DCHECK_EQ(field_count(), 2);
  return field(1);
}